

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O3

void __thiscall
tcu::ResultCollector::ResultCollector(ResultCollector *this,TestLog *log,string *prefix)

{
  pointer pcVar1;
  
  this->m_log = log;
  (this->m_prefix)._M_dataplus._M_p = (pointer)&(this->m_prefix).field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_prefix,pcVar1,pcVar1 + prefix->_M_string_length);
  this->m_result = QP_TEST_RESULT_LAST;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_message,"Pass","");
  return;
}

Assistant:

ResultCollector::ResultCollector (TestLog& log, const std::string& prefix)
	: m_log		(&log)
	, m_prefix	(prefix)
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}